

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::PartialBlockManager::ClearBlocks(PartialBlockManager *this)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var2 !=
        &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    pPVar1 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
             operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                         *)&p_Var2[1]._M_parent);
    (*pPVar1->_vptr_PartialBlock[4])(pPVar1);
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
  ::clear(&(this->partially_filled_blocks)._M_t);
  return;
}

Assistant:

void PartialBlockManager::ClearBlocks() {
	for (auto &e : partially_filled_blocks) {
		e.second->Clear();
	}
	partially_filled_blocks.clear();
}